

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeFloatingState.cpp
# Opt level: O0

void __thiscall iDynTree::FreeFloatingVel::FreeFloatingVel(FreeFloatingVel *this)

{
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  
  (in_RDI->linearVec3).super_Vector3.m_data[0] = (double)&PTR__FreeFloatingVel_004f9f38;
  iDynTree::Twist::Twist((Twist *)((in_RDI->linearVec3).super_Vector3.m_data + 1));
  JointDOFsDoubleArray::JointDOFsDoubleArray
            ((JointDOFsDoubleArray *)in_RDI,in_stack_ffffffffffffffc8);
  SpatialVector<iDynTree::SpatialMotionVector>::zero(in_RDI);
  JointDOFsDoubleArray::resize((JointDOFsDoubleArray *)in_RDI,in_stack_ffffffffffffffc8);
  iDynTree::VectorDynSize::zero();
  return;
}

Assistant:

FreeFloatingVel::FreeFloatingVel()
{
    this->m_baseVel.zero();
    this->m_jointVel.resize(0);
    this->m_jointVel.zero();
}